

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void pcut_print_items(pcut_item_t *first)

{
  char *pcVar1;
  char *__format;
  
  puts("====>");
  if (first != (pcut_item_t *)0x0) {
    do {
      switch(first->kind) {
      case 0:
        break;
      case 1:
        puts("NESTED ...");
        break;
      default:
        printf("UNKNOWN (%d)\n");
        break;
      case 4:
        pcVar1 = first->name;
        __format = "SUITE %s\n";
        goto LAB_00101a8b;
      case 5:
        pcVar1 = first->name;
        __format = "TEST %s\n";
LAB_00101a8b:
        printf(__format,pcVar1);
      }
      first = first->next;
    } while (first != (pcut_item_t *)0x0);
  }
  puts("----");
  return;
}

Assistant:

void pcut_print_items(pcut_item_t *first) {
	pcut_item_t *it = first;
	printf("====>\n");
	while (it != NULL) {
		switch (it->kind) {
		case PCUT_KIND_TEST:
			printf("TEST %s\n", it->name);
			break;
		case PCUT_KIND_TESTSUITE:
			printf("SUITE %s\n", it->name);
			break;
		case PCUT_KIND_SKIP:
			break;
		case PCUT_KIND_NESTED:
			printf("NESTED ...\n");
			break;
		default:
			printf("UNKNOWN (%d)\n", it->kind);
			break;
		}
		it = it->next;
	}
	printf("----\n");
}